

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darRefact.c
# Opt level: O1

int Dar_ManRefactor(Aig_Man_t *pAig,Dar_RefPar_t *pPars)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  Aig_Obj_t *pNode;
  Dar_RefPar_t *pDVar4;
  undefined8 uVar5;
  Kit_Graph_t *pGraph;
  Vec_Ptr_t *vLeaves;
  int iVar6;
  int iVar7;
  Ref_Man_t *p;
  Vec_Ptr_t *pVVar8;
  Aig_Obj_t *pObjNew;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  timespec ts;
  timespec local_78;
  int local_64;
  Ref_Man_t *local_60;
  int local_58;
  int local_54;
  Vec_Ptr_t *local_50;
  long local_48;
  Vec_Ptr_t *local_40;
  ulong local_38;
  
  p = Dar_ManRefStart(pAig,pPars);
  Aig_ManCleanup(pAig);
  Aig_ManFanoutStart(pAig);
  if (p->pPars->fUpdateLevel != 0) {
    Aig_ManStartReverseLevels(pAig,0);
  }
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    local_48 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_48 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  iVar6 = p->vCuts->nSize;
  if ((iVar6 < 1) || (iVar6 == 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  ppvVar3 = p->vCuts->pArray;
  local_40 = (Vec_Ptr_t *)*ppvVar3;
  local_50 = (Vec_Ptr_t *)ppvVar3[1];
  p->nNodesInit = pAig->nObjs[6] + pAig->nObjs[5];
  pVVar8 = pAig->vObjs;
  local_38 = (ulong)pVVar8->nSize;
  if (0 < (long)local_38) {
    uVar12 = 0;
    local_60 = p;
    do {
      pNode = (Aig_Obj_t *)pVVar8->pArray[uVar12];
      if ((pNode != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pNode->field_0x18 & 7) - 7)) {
        if (local_38 < uVar12) break;
        if ((((uint)uVar12 >> 8 & 1) == 0) && (pAig->Time2Quit != 0)) {
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar9 = -1;
          }
          else {
            lVar9 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          if (pAig->Time2Quit < lVar9) break;
        }
        lVar9 = (long)p->vCuts->nSize;
        if (0 < lVar9) {
          ppvVar3 = p->vCuts->pArray;
          lVar10 = 0;
          do {
            *(undefined4 *)((long)ppvVar3[lVar10] + 4) = 0;
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
        iVar6 = clock_gettime(3,&local_78);
        pVVar8 = local_40;
        if (iVar6 < 0) {
          lVar9 = 1;
        }
        else {
          lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
          lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_78.tv_sec * -1000000;
        }
        if (((ulong)pNode & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
        }
        uVar13 = *(uint *)&pNode->field_0x1c & 0xffffff;
        if (uVar13 < 0xb) {
          uVar13 = 10;
        }
        iVar6 = Aig_NodeMffcSupp(pAig,pNode,uVar13 - 10,local_40);
        vLeaves = local_40;
        pDVar4 = p->pPars;
        if (iVar6 < pDVar4->nMffcMin) {
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar10 = -1;
          }
          else {
            lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          local_60->timeCuts = local_60->timeCuts + lVar10 + lVar9;
          p = local_60;
        }
        else {
          p->nNodesTried = p->nNodesTried + 1;
          uVar1 = pVVar8->nSize;
          iVar7 = pDVar4->nLeafMax;
          if (iVar7 < (int)uVar1) {
            Aig_ManFindCut(pNode,pVVar8,p->vCutNodes,iVar7,0x32);
            local_64 = Aig_NodeMffcLabelCut(p->pAig,pNode,pVVar8);
          }
          else {
            p = local_60;
            local_64 = iVar6;
            if (((int)uVar1 < iVar7 + -2) && (pDVar4->fExtend != 0)) {
              if (0 < (int)uVar1) {
                uVar11 = 0;
                do {
                  uVar5 = *(undefined8 *)((long)local_40->pArray[uVar11] + 0x18);
                  if ((((uint)uVar5 & 7) != 2) &&
                     ((int)((uint)((ulong)uVar5 >> 0x20) & 0xffffff) <= (int)(uVar13 - 10))) {
                    local_60->nNodesBelow = local_60->nNodesBelow + 1;
                    goto LAB_004f2a4c;
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar1 != uVar11);
              }
              iVar6 = Aig_NodeMffcExtendCut(pAig,pNode,local_40,local_50);
              if ((iVar6 != 0) &&
                 (iVar6 = Aig_NodeMffcLabelCut(local_60->pAig,pNode,vLeaves), iVar6 != local_64)) {
                __assert_fail("nNodesSaved2 == nNodesSaved",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                              ,0x22c,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
              }
              if (pDVar4->nLeafMax < local_50->nSize) {
                local_50->nSize = 0;
              }
              p = local_60;
              if (0 < local_50->nSize) {
                local_60->nNodesExten = local_60->nNodesExten + 1;
              }
            }
          }
LAB_004f2a4c:
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar10 = -1;
          }
          else {
            lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          p->timeCuts = p->timeCuts + lVar10 + lVar9;
          iVar6 = clock_gettime(3,&local_78);
          if (iVar6 < 0) {
            lVar9 = 1;
          }
          else {
            lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
            lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_78.tv_sec * -1000000;
          }
          if (pAig->vLevelR == (Vec_Int_t *)0x0) {
            iVar6 = 1000000000;
          }
          else {
            iVar6 = Aig_ObjRequiredLevel(pAig,pNode);
          }
          Dar_ManRefactorTryCuts(p,pNode,local_64,iVar6);
          iVar7 = clock_gettime(3,&local_78);
          if (iVar7 < 0) {
            lVar10 = -1;
          }
          else {
            lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          p->timeEval = p->timeEval + lVar10 + lVar9;
          iVar7 = p->GainBest;
          if ((iVar7 < 1) && ((iVar7 != 0 || (p->pPars->fUseZeros == 0)))) {
            if (p->pGraphBest != (Kit_Graph_t *)0x0) {
              Kit_GraphFree(p->pGraphBest);
            }
          }
          else {
            local_58 = pAig->nObjs[5];
            iVar2 = pAig->nObjs[6];
            pGraph = p->pGraphBest;
            local_64 = iVar6;
            local_54 = iVar7;
            pObjNew = Dar_RefactBuildGraph(pAig,p->vLeavesBest,pGraph);
            if (local_64 < (int)(*(uint *)(((ulong)pObjNew & 0xfffffffffffffffe) + 0x1c) & 0xffffff)
               ) {
              __assert_fail("(int)Aig_Regular(pObjNew)->Level <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                            ,0x24d,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
            }
            Aig_ObjReplace(pAig,pNode,pObjNew,p->pPars->fUpdateLevel);
            if ((iVar2 + local_58) - (pAig->nObjs[5] + pAig->nObjs[6]) < local_54) {
              __assert_fail("p->GainBest <= nNodeBefore - nNodeAfter",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darRefact.c"
                            ,0x252,"int Dar_ManRefactor(Aig_Man_t *, Dar_RefPar_t *)");
            }
            Kit_GraphFree(pGraph);
            p->nCutsUsed = p->nCutsUsed + 1;
          }
        }
      }
      uVar12 = uVar12 + 1;
      pVVar8 = pAig->vObjs;
    } while ((long)uVar12 < (long)pVVar8->nSize);
  }
  iVar6 = clock_gettime(3,&local_78);
  if (iVar6 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  p->timeTotal = lVar9 + local_48;
  p->timeOther = (lVar9 + local_48) - (p->timeCuts + p->timeEval);
  Aig_ManFanoutStop(pAig);
  if (p->pPars->fUpdateLevel != 0) {
    Aig_ManStopReverseLevels(pAig);
  }
  Aig_ManCleanup(pAig);
  Dar_ManRefStop(p);
  iVar6 = Aig_ManCheck(pAig);
  if (iVar6 == 0) {
    puts("Dar_ManRefactor: The network check has failed.");
  }
  return (uint)(iVar6 != 0);
}

Assistant:

int Dar_ManRefactor( Aig_Man_t * pAig, Dar_RefPar_t * pPars )
{
//    Bar_Progress_t * pProgress;
    Ref_Man_t * p;
    Vec_Ptr_t * vCut, * vCut2;
    Aig_Obj_t * pObj, * pObjNew;
    int nNodesOld, nNodeBefore, nNodeAfter, nNodesSaved, nNodesSaved2;
    int i, Required, nLevelMin;
    abctime clkStart, clk;

    // start the manager
    p = Dar_ManRefStart( pAig, pPars );
    // remove dangling nodes
    Aig_ManCleanup( pAig );
    // if updating levels is requested, start fanout and timing
    Aig_ManFanoutStart( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStartReverseLevels( pAig, 0 );

    // resynthesize each node once
    clkStart = Abc_Clock();
    vCut = Vec_VecEntry( p->vCuts, 0 );
    vCut2 = Vec_VecEntry( p->vCuts, 1 );
    p->nNodesInit = Aig_ManNodeNum(pAig);
    nNodesOld = Vec_PtrSize( pAig->vObjs );
//    pProgress = Bar_ProgressStart( stdout, nNodesOld );
    Aig_ManForEachObj( pAig, pObj, i )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( i > nNodesOld )
            break;
        if ( pAig->Time2Quit && !(i & 256) && Abc_Clock() > pAig->Time2Quit )
            break;
        Vec_VecClear( p->vCuts );

//printf( "\nConsidering node %d.\n", pObj->Id );
        // get the bounded MFFC size
clk = Abc_Clock();
        nLevelMin = Abc_MaxInt( 0, Aig_ObjLevel(pObj) - 10 );
        nNodesSaved = Aig_NodeMffcSupp( pAig, pObj, nLevelMin, vCut );
        if ( nNodesSaved < p->pPars->nMffcMin ) // too small to consider
        {
p->timeCuts += Abc_Clock() - clk;
            continue; 
        }
        p->nNodesTried++;
        if ( Vec_PtrSize(vCut) > p->pPars->nLeafMax ) // get one reconv-driven cut
        {
            Aig_ManFindCut( pObj, vCut, p->vCutNodes, p->pPars->nLeafMax, 50 );
            nNodesSaved = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
        }
        else if ( Vec_PtrSize(vCut) < p->pPars->nLeafMax - 2 && p->pPars->fExtend )
        {
            if ( !Dar_ObjCutLevelAchieved(vCut, nLevelMin) )
            {
                if ( Aig_NodeMffcExtendCut( pAig, pObj, vCut, vCut2 ) )
                {
                    nNodesSaved2 = Aig_NodeMffcLabelCut( p->pAig, pObj, vCut );
                    assert( nNodesSaved2 == nNodesSaved );
                }
                if ( Vec_PtrSize(vCut2) > p->pPars->nLeafMax )
                    Vec_PtrClear(vCut2);
                if ( Vec_PtrSize(vCut2) > 0 )
                {
                    p->nNodesExten++;
//                    printf( "%d(%d) ", Vec_PtrSize(vCut), Vec_PtrSize(vCut2) );
                }
            }
            else
                p->nNodesBelow++;
        }
p->timeCuts += Abc_Clock() - clk;

        // try the cuts
clk = Abc_Clock();
        Required = pAig->vLevelR? Aig_ObjRequiredLevel(pAig, pObj) : ABC_INFINITY;
        Dar_ManRefactorTryCuts( p, pObj, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;

        // check the best gain
        if ( !(p->GainBest > 0 || (p->GainBest == 0 && p->pPars->fUseZeros)) )
        {
            if ( p->pGraphBest )
                Kit_GraphFree( p->pGraphBest );
            continue;
        }
//printf( "\n" );

        // if we end up here, a rewriting step is accepted
        nNodeBefore = Aig_ManNodeNum( pAig );
        pObjNew = Dar_RefactBuildGraph( pAig, p->vLeavesBest, p->pGraphBest );
        assert( (int)Aig_Regular(pObjNew)->Level <= Required );
        // replace the node
        Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
        // compare the gains
        nNodeAfter = Aig_ManNodeNum( pAig );
        assert( p->GainBest <= nNodeBefore - nNodeAfter );
        Kit_GraphFree( p->pGraphBest );
        p->nCutsUsed++;
//        break;
    }
p->timeTotal = Abc_Clock() - clkStart;
p->timeOther = p->timeTotal - p->timeCuts - p->timeEval;

//    Bar_ProgressStop( pProgress );
    // put the nodes into the DFS order and reassign their IDs
//    Aig_NtkReassignIds( p );
    // fix the levels
    Aig_ManFanoutStop( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStopReverseLevels( pAig );
/*
    Aig_ManForEachObj( p->pAig, pObj, i )
        if ( Aig_ObjIsNode(pObj) && Aig_ObjRefs(pObj) == 0 )
        {
            printf( "Unreferenced " );
            Aig_ObjPrintVerbose( pObj, 0 );
            printf( "\n" );
        }
*/
    // remove dangling nodes (they should not be here!)
    Aig_ManCleanup( pAig );

    // stop the rewriting manager
    Dar_ManRefStop( p );
//    Aig_ManCheckPhase( pAig );
    if ( !Aig_ManCheck( pAig ) )
    {
        printf( "Dar_ManRefactor: The network check has failed.\n" );
        return 0;
    }
    return 1;

}